

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_esni_init_context
              (ptls_context_t *ctx,ptls_esni_context_t *esni,ptls_iovec_t esni_keys,
              ptls_key_exchange_context_t **key_exchanges)

{
  long *plVar1;
  ushort *end;
  ushort uVar2;
  ptls_key_exchange_context_t *ppVar3;
  ushort *puVar4;
  int iVar5;
  ptls_key_exchange_context_t **pppVar6;
  ushort *puVar7;
  anon_struct_72_2_510fbff9 *paVar8;
  ulong len;
  ulong uVar9;
  uint8_t *src;
  ulong uVar10;
  ushort *puVar11;
  long lVar12;
  size_t __size;
  ushort *puVar13;
  ushort *puVar14;
  long lVar15;
  ushort *local_58;
  ushort *local_50;
  long local_48;
  long local_40;
  ushort *local_38;
  
  len = esni_keys.len;
  src = esni_keys.base;
  __size = 0;
  do {
    plVar1 = (long *)((long)key_exchanges + __size);
    __size = __size + 8;
  } while (*plVar1 != 0);
  esni->not_before = 0;
  esni->not_after = 0;
  esni->cipher_suites = (anon_struct_72_2_510fbff9 *)0x0;
  *(undefined8 *)&esni->padded_length = 0;
  pppVar6 = (ptls_key_exchange_context_t **)malloc(__size);
  esni->key_exchanges = pppVar6;
  iVar5 = 0x201;
  if (pppVar6 != (ptls_key_exchange_context_t **)0x0) {
    memcpy(pppVar6,key_exchanges,__size);
    if ((long)len < 6) {
      iVar5 = 0x33;
    }
    else {
      if (((len & 0x7ffffffffffffffe) != 6) &&
         (uVar9 = (ulong)(ushort)(*(ushort *)(src + 6) << 8 | *(ushort *)(src + 6) >> 8),
         uVar9 <= len - 8)) {
        end = (ushort *)(src + len);
        puVar7 = (ushort *)(src + 8);
        puVar13 = (ushort *)(src + uVar9 + 8);
        do {
          if (((long)puVar13 - (long)puVar7 < 2) || (((long)puVar13 - (long)puVar7) - 2U < 2))
          goto LAB_0010d4c5;
          uVar10 = (ulong)(ushort)(puVar7[1] << 8 | puVar7[1] >> 8);
          if ((ulong)((long)puVar13 - (long)(puVar7 + 2)) < uVar10) goto LAB_0010d4c5;
          uVar2 = *puVar7;
          puVar7 = (ushort *)((long)(puVar7 + 2) + uVar10);
          pppVar6 = key_exchanges;
          do {
            ppVar3 = *pppVar6;
            if (ppVar3 == (ptls_key_exchange_context_t *)0x0) break;
            pppVar6 = pppVar6 + 1;
          } while (ppVar3->algo->id != (uint16_t)(uVar2 << 8 | uVar2 >> 8));
        } while (puVar7 != puVar13);
        if (1 < (ulong)((long)end - (long)puVar13)) {
          uVar10 = (ulong)(ushort)(*puVar13 << 8 | *puVar13 >> 8);
          puVar7 = (ushort *)(src + uVar9 + 10);
          if (uVar10 <= (ulong)((long)end - (long)puVar7)) {
            puVar13 = (ushort *)(uVar10 + (long)puVar7);
            paVar8 = (anon_struct_72_2_510fbff9 *)0x0;
            lVar15 = 0;
            local_50 = puVar13;
            do {
              if ((long)puVar13 - (long)puVar7 < 2) goto LAB_0010d4c5;
              puVar14 = puVar7 + 1;
              for (lVar12 = 0; puVar4 = *(ushort **)((long)ctx->cipher_suites + lVar12),
                  puVar11 = puVar7, puVar4 != (ushort *)0x0; lVar12 = lVar12 + 8) {
                if (*puVar4 == (ushort)(*puVar7 << 8 | *puVar7 >> 8)) {
                  local_40 = lVar15 + 1;
                  local_48 = lVar15;
                  local_38 = puVar7;
                  paVar8 = (anon_struct_72_2_510fbff9 *)realloc(paVar8,local_40 * 0x48);
                  if (paVar8 == (anon_struct_72_2_510fbff9 *)0x0) goto LAB_0010d4c7;
                  esni->cipher_suites = paVar8;
                  paVar8[local_48].cipher_suite =
                       *(ptls_cipher_suite_t **)((long)ctx->cipher_suites + lVar12);
                  puVar11 = local_38;
                  puVar13 = local_50;
                  lVar15 = local_40;
                  break;
                }
              }
              puVar7 = puVar14;
            } while (puVar14 != puVar13);
            paVar8 = (anon_struct_72_2_510fbff9 *)realloc(paVar8,lVar15 * 0x48 + 0x48);
            if (paVar8 != (anon_struct_72_2_510fbff9 *)0x0) {
              esni->cipher_suites = paVar8;
              paVar8[lVar15].cipher_suite = (ptls_cipher_suite_t *)0x0;
              if (1 < (long)end - (long)puVar14) {
                esni->padded_length = puVar11[1] << 8 | puVar11[1] >> 8;
                local_58 = puVar11 + 2;
                iVar5 = ptls_decode64(&esni->not_before,(uint8_t **)&local_58,(uint8_t *)end);
                if ((iVar5 != 0) ||
                   (iVar5 = ptls_decode64(&esni->not_after,(uint8_t **)&local_58,(uint8_t *)end),
                   iVar5 != 0)) goto LAB_0010d4c7;
                if (1 < (ulong)((long)end - (long)local_58)) {
                  uVar9 = (ulong)(ushort)(*local_58 << 8 | *local_58 >> 8);
                  puVar7 = local_58 + 1;
                  if (uVar9 <= (ulong)((long)end - (long)puVar7)) {
                    puVar13 = (ushort *)(uVar9 + (long)puVar7);
                    for (; puVar7 != puVar13; puVar7 = (ushort *)((long)(puVar7 + 2) + uVar9)) {
                      if (((long)puVar13 - (long)puVar7 < 2) ||
                         (((long)puVar13 - (long)puVar7) - 2U < 2)) goto LAB_0010d652;
                      uVar9 = (ulong)(ushort)(puVar7[1] << 8 | puVar7[1] >> 8);
                      if ((ulong)((long)puVar13 - (long)(puVar7 + 2)) < uVar9) goto LAB_0010d652;
                    }
                    iVar5 = 0x32;
                    if (puVar13 == end) {
                      lVar15 = 8;
                      do {
                        lVar12 = *(long *)(esni->cipher_suites->record_digest + lVar15 + -0x10);
                        if (lVar12 == 0) {
                          return 0;
                        }
                        iVar5 = ptls_calc_hash(*(ptls_hash_algorithm_t **)(lVar12 + 0x10),
                                               esni->cipher_suites->record_digest + lVar15 + -8,src,
                                               len);
                        lVar15 = lVar15 + 0x48;
                      } while (iVar5 == 0);
                    }
                    goto LAB_0010d4c7;
                  }
                }
              }
LAB_0010d652:
              iVar5 = 0x32;
            }
            goto LAB_0010d4c7;
          }
        }
      }
LAB_0010d4c5:
      iVar5 = 0x32;
    }
  }
LAB_0010d4c7:
  ptls_esni_dispose_context(esni);
  return iVar5;
}

Assistant:

int ptls_esni_init_context(ptls_context_t *ctx, ptls_esni_context_t *esni, ptls_iovec_t esni_keys,
                           ptls_key_exchange_context_t **key_exchanges)
{
    const uint8_t *src = esni_keys.base, *const end = src + esni_keys.len;
    size_t num_key_exchanges, num_cipher_suites = 0;
    int ret;

    for (num_key_exchanges = 0; key_exchanges[num_key_exchanges] != NULL; ++num_key_exchanges)
        ;

    memset(esni, 0, sizeof(*esni));
    if ((esni->key_exchanges = malloc(sizeof(*esni->key_exchanges) * (num_key_exchanges + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(esni->key_exchanges, key_exchanges, sizeof(*esni->key_exchanges) * (num_key_exchanges + 1));

    /* ESNIKeys */
    if (end - src < 6) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    src += 6;
    ptls_decode_open_block(src, end, 2, {
        do {
            /* parse */
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
            /* check that matching key-share exists */
            ptls_key_exchange_context_t **found;
            for (found = key_exchanges; *found != NULL; ++found)
                if ((*found)->algo->id == id)
                    break;
            if (found == NULL) {
                ret = PTLS_ERROR_INCOMPATIBLE_KEY;
                goto Exit;
            }
        } while (src != end);
    });
    ptls_decode_open_block(src, end, 2, {
        void *newp;
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            size_t i;
            for (i = 0; ctx->cipher_suites[i] != NULL; ++i)
                if (ctx->cipher_suites[i]->id == id)
                    break;
            if (ctx->cipher_suites[i] != NULL) {
                if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                esni->cipher_suites = newp;
                esni->cipher_suites[num_cipher_suites++].cipher_suite = ctx->cipher_suites[i];
            }
        } while (src != end);
        if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        esni->cipher_suites = newp;
        esni->cipher_suites[num_cipher_suites].cipher_suite = NULL;
    });
    if ((ret = ptls_decode16(&esni->padded_length, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_before, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_after, &src, end)) != 0)
        goto Exit;
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t ext_type;
            if ((ret = ptls_decode16(&ext_type, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    { /* calculate digests for every cipher-suite */
        size_t i;
        for (i = 0; esni->cipher_suites[i].cipher_suite != NULL; ++i) {
            if ((ret = ptls_calc_hash(esni->cipher_suites[i].cipher_suite->hash, esni->cipher_suites[i].record_digest,
                                      esni_keys.base, esni_keys.len)) != 0)
                goto Exit;
        }
    }

    ret = 0;
Exit:
    if (ret != 0)
        ptls_esni_dispose_context(esni);
    return ret;
}